

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::bcd<(moira::Instr)3,(moira::Size)1>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  ushort uVar2;
  u32 uVar3;
  ulong uVar4;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  u64 tmp_result;
  u16 resHi;
  u16 resLo;
  u16 op2_lo;
  u16 op2_hi;
  u16 op1_lo;
  u16 op1_hi;
  u64 result;
  bool local_39;
  ulong local_18;
  
  uVar2 = (in_SI & 0xf) + (in_DX & 0xf) + (ushort)(*(byte *)(in_RDI + 0x5c9a) & 1);
  uVar4 = (ulong)(int)((uint)(ushort)((in_SI & 0xf0) + (in_DX & 0xf0)) + (uint)uVar2);
  local_18 = uVar4;
  if (9 < uVar2) {
    local_18 = uVar4 + 6;
  }
  bVar1 = 0x90 < (local_18 & 0x3f0);
  *(bool *)(in_RDI + 0x5c9e) = bVar1;
  *(bool *)(in_RDI + 0x5c9a) = bVar1;
  if ((*(byte *)(in_RDI + 0x5c9e) & 1) != 0) {
    local_18 = local_18 + 0x60;
  }
  uVar3 = CLIP<(moira::Size)1>(local_18);
  if (uVar3 != 0) {
    *(undefined1 *)(in_RDI + 0x5c9c) = 0;
  }
  bVar1 = NBIT<(moira::Size)1>(local_18);
  *(bool *)(in_RDI + 0x5c9b) = bVar1;
  local_39 = (uVar4 & 0x80) == 0 && (local_18 & 0x80) == 0x80;
  *(bool *)(in_RDI + 0x5c9d) = local_39;
  bVar1 = NBIT<(moira::Size)1>(local_18);
  *(bool *)(in_RDI + 0x5c9b) = bVar1;
  return (u32)local_18;
}

Assistant:

u32
Moira::bcd(u32 op1, u32 op2)
{
    u64 result;

    switch(I) {

        case ABCD:
        {
            // Extract nibbles
            u16 op1_hi = op1 & 0xF0, op1_lo = op1 & 0x0F;
            u16 op2_hi = op2 & 0xF0, op2_lo = op2 & 0x0F;

            // From portable68000
            u16 resLo = op1_lo + op2_lo + reg.sr.x;
            u16 resHi = op1_hi + op2_hi;
            u64 tmp_result;
            result = tmp_result = resHi + resLo;
            if (resLo > 9) result += 6;
            reg.sr.x = reg.sr.c = (result & 0x3F0) > 0x90;
            if (reg.sr.c) result += 0x60;
            if (CLIP<Byte>(result)) reg.sr.z = 0;
            reg.sr.n = NBIT<Byte>(result);
            reg.sr.v = ((tmp_result & 0x80) == 0) && ((result & 0x80) == 0x80);
            break;
        }
        case SBCD:
        {
            // Extract nibbles
            u16 op1_hi = op1 & 0xF0, op1_lo = op1 & 0x0F;
            u16 op2_hi = op2 & 0xF0, op2_lo = op2 & 0x0F;

            // From portable68000
            u16 resLo = op2_lo - op1_lo - reg.sr.x;
            u16 resHi = op2_hi - op1_hi;
            u64 tmp_result;
            result = tmp_result = resHi + resLo;
            int bcd = 0;
            if (resLo & 0xf0) {
                bcd = 6;
                result -= 6;
            }
            if (((op2 - op1 - reg.sr.x) & 0x100) > 0xff) result -= 0x60;
            reg.sr.c = reg.sr.x = ((op2 - op1 - bcd - reg.sr.x) & 0x300) > 0xff;

            if (CLIP<Byte>(result)) reg.sr.z = 0;
            reg.sr.n = NBIT<Byte>(result);
            reg.sr.v = ((tmp_result & 0x80) == 0x80) && ((result & 0x80) == 0);
            break;
        }
        default:
        {
            assert(false);
        }
    }
    reg.sr.n = NBIT<S>(result);
    return (u32)result;
}